

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::PrintTupleTo<std::tuple<bool,unsigned_int>,2ul>(long t,ostream *param_2)

{
  char *pcVar1;
  
  pcVar1 = "false";
  if ((ulong)*(byte *)(t + 4) != 0) {
    pcVar1 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>(param_2,pcVar1,(ulong)*(byte *)(t + 4) ^ 5);
  std::__ostream_insert<char,std::char_traits<char>>(param_2,", ",2);
  std::ostream::_M_insert<unsigned_long>((ulong)param_2);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}